

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeVertexDualAreas
          (IntrinsicGeometryInterface *this)

{
  double dVar1;
  SurfaceMesh *pSVar2;
  size_t sVar3;
  pointer puVar4;
  double *pdVar5;
  double *pdVar6;
  pointer puVar7;
  pointer puVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  long lVar11;
  size_t sVar12;
  unsigned_long uVar13;
  MeshData<geometrycentral::surface::Vertex,_double> MStack_48;
  
  if ((this->faceAreasQ).super_DependentQuantity.computed == false) {
    if ((this->faceAreasQ).super_DependentQuantity.evaluateFunc.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*(this->faceAreasQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->faceAreasQ).super_DependentQuantity.evaluateFunc);
    (this->faceAreasQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Vertex,_double>::MeshData
            (&MStack_48,(this->super_BaseGeometryInterface).mesh,0.0);
  MeshData<geometrycentral::surface::Vertex,_double>::operator=(&this->vertexDualAreas,&MStack_48);
  MeshData<geometrycentral::surface::Vertex,_double>::~MeshData(&MStack_48);
  pSVar2 = (this->super_BaseGeometryInterface).mesh;
  sVar3 = pSVar2->nFacesFillCount;
  if ((sVar3 == 0) ||
     (puVar4 = (pSVar2->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar4 != 0xffffffffffffffff)) {
    sVar12 = 0;
  }
  else {
    sVar12 = 0;
    do {
      if (sVar3 - 1 == sVar12) {
        return;
      }
      lVar11 = sVar12 + 1;
      sVar12 = sVar12 + 1;
    } while (puVar4[lVar11] == 0xffffffffffffffff);
  }
  if (sVar12 != sVar3) {
    pdVar5 = (this->faceAreas).data.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pdVar6 = (this->vertexDualAreas).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    puVar4 = (pSVar2->fHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (pSVar2->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar8 = (pSVar2->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      dVar1 = pdVar5[sVar12];
      uVar9 = puVar4[sVar12];
      uVar13 = uVar9;
      do {
        uVar10 = puVar8[uVar13];
        pdVar6[uVar10] = dVar1 / 3.0 + pdVar6[uVar10];
        uVar13 = puVar7[uVar13];
      } while (uVar13 != uVar9);
      do {
        if (sVar3 - 1 == sVar12) {
          return;
        }
        lVar11 = sVar12 + 1;
        sVar12 = sVar12 + 1;
      } while (puVar4[lVar11] == 0xffffffffffffffff);
    } while (sVar3 != sVar12);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeVertexDualAreas() {
  faceAreasQ.ensureHave();

  vertexDualAreas = VertexData<double>(mesh, 0.);

  for (Face f : mesh.faces()) {
    double A = faceAreas[f];
    for (Vertex v : f.adjacentVertices()) {
      vertexDualAreas[v] += A / 3.0;
    }
  }
}